

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O0

void aom_film_grain_table_append
               (aom_film_grain_table_t *t,int64_t time_stamp,int64_t end_time,
               aom_film_grain_t *grain)

{
  int iVar1;
  void *__s;
  void *in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  aom_film_grain_table_entry_t *new_tail;
  long local_38;
  long local_30;
  
  if ((in_RDI[1] == 0) || (iVar1 = memcmp(in_RCX,(void *)in_RDI[1],0x288), iVar1 != 0)) {
    __s = aom_malloc(0x3b391f);
    if (__s != (void *)0x0) {
      memset(__s,0,0x2a0);
      if (in_RDI[1] != 0) {
        *(void **)(in_RDI[1] + 0x298) = __s;
      }
      if (*in_RDI == 0) {
        *in_RDI = (long)__s;
      }
      in_RDI[1] = (long)__s;
      *(long *)((long)__s + 0x288) = in_RSI;
      *(long *)((long)__s + 0x290) = in_RDX;
      memcpy(__s,in_RCX,0x288);
    }
  }
  else {
    local_30 = in_RDX;
    if (in_RDX < *(long *)(in_RDI[1] + 0x290)) {
      local_30 = *(long *)(in_RDI[1] + 0x290);
    }
    *(long *)(in_RDI[1] + 0x290) = local_30;
    local_38 = in_RSI;
    if (*(long *)(in_RDI[1] + 0x288) < in_RSI) {
      local_38 = *(long *)(in_RDI[1] + 0x288);
    }
    *(long *)(in_RDI[1] + 0x288) = local_38;
  }
  return;
}

Assistant:

void aom_film_grain_table_append(aom_film_grain_table_t *t, int64_t time_stamp,
                                 int64_t end_time,
                                 const aom_film_grain_t *grain) {
  if (!t->tail || memcmp(grain, &t->tail->params, sizeof(*grain))) {
    aom_film_grain_table_entry_t *new_tail = aom_malloc(sizeof(*new_tail));
    if (!new_tail) return;
    memset(new_tail, 0, sizeof(*new_tail));
    if (t->tail) t->tail->next = new_tail;
    if (!t->head) t->head = new_tail;
    t->tail = new_tail;

    new_tail->start_time = time_stamp;
    new_tail->end_time = end_time;
    new_tail->params = *grain;
  } else {
    t->tail->end_time = AOMMAX(t->tail->end_time, end_time);
    t->tail->start_time = AOMMIN(t->tail->start_time, time_stamp);
  }
}